

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderStructTests.cpp
# Opt level: O2

ShaderStructCase *
deqp::createStructCase
          (Context *context,char *name,char *description,GLSLVersion glslVersion,bool isVertexCase,
          bool usesTextures,ShaderEvalFunc evalFunc,SetupUniformsFunc setupUniforms,
          LineStream *shaderSrc)

{
  char *pcVar1;
  mapped_type *pmVar2;
  ShaderStructCase *this;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  key_type local_100;
  string local_e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  spParams;
  string versionDecl;
  string defaultFragSrc;
  string defaultVertSrc;
  
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&versionDecl,pcVar1,(allocator<char> *)&spParams);
  std::operator+(&defaultVertSrc,&versionDecl,
                 "\nin highp vec4 a_position;\nin highp vec4 a_coords;\nout mediump vec4 v_coords;\n\nvoid main (void)\n{\n   v_coords = a_coords;\n   gl_Position = a_position;\n}\n"
                );
  std::operator+(&defaultFragSrc,&versionDecl,
                 "\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n   o_color = v_color;\n}\n"
                );
  spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &spParams._M_t._M_impl.super__Rb_tree_header._M_header;
  spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  spParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (isVertexCase) {
    std::operator+(&local_120,&versionDecl,
                   "\nin highp vec4 a_position;\nin highp vec4 a_coords;\nout mediump vec4 v_color;"
                  );
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"HEADER",(allocator<char> *)&local_e0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_100);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"COORDS",(allocator<char> *)&local_100);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_120);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"DST",(allocator<char> *)&local_100);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_120);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"ASSIGN_POS",(allocator<char> *)&local_100);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_120);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_120);
    this = (ShaderStructCase *)operator_new(0x140);
    pcVar1 = LineStream::str(shaderSrc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar1,&local_121);
    tcu::StringTemplate::StringTemplate((StringTemplate *)&local_100,&local_e0);
    tcu::StringTemplate::specialize(&local_120,(StringTemplate *)&local_100,&spParams);
    ShaderStructCase::ShaderStructCase
              (this,context,name,description,true,usesTextures,evalFunc,setupUniforms,
               local_120._M_dataplus._M_p,defaultFragSrc._M_dataplus._M_p);
  }
  else {
    std::operator+(&local_120,&versionDecl,
                   "\nin mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"HEADER",(allocator<char> *)&local_e0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_100);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"COORDS",(allocator<char> *)&local_100);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_120);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"DST",(allocator<char> *)&local_100);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_120);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"ASSIGN_POS",(allocator<char> *)&local_100);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_120);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_120);
    this = (ShaderStructCase *)operator_new(0x140);
    pcVar1 = LineStream::str(shaderSrc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar1,&local_121);
    tcu::StringTemplate::StringTemplate((StringTemplate *)&local_100,&local_e0);
    tcu::StringTemplate::specialize(&local_120,(StringTemplate *)&local_100,&spParams);
    ShaderStructCase::ShaderStructCase
              (this,context,name,description,false,usesTextures,evalFunc,setupUniforms,
               defaultVertSrc._M_dataplus._M_p,local_120._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_120);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&spParams._M_t);
  std::__cxx11::string::~string((string *)&defaultFragSrc);
  std::__cxx11::string::~string((string *)&defaultVertSrc);
  std::__cxx11::string::~string((string *)&versionDecl);
  return this;
}

Assistant:

static ShaderStructCase* createStructCase(Context& context, const char* name, const char* description,
										  glu::GLSLVersion glslVersion, bool isVertexCase, bool usesTextures,
										  ShaderEvalFunc evalFunc, SetupUniformsFunc setupUniforms,
										  const LineStream& shaderSrc)
{
	const std::string versionDecl = glu::getGLSLVersionDeclaration(glslVersion);

	const std::string defaultVertSrc = versionDecl + "\n"
													 "in highp vec4 a_position;\n"
													 "in highp vec4 a_coords;\n"
													 "out mediump vec4 v_coords;\n\n"
													 "void main (void)\n"
													 "{\n"
													 "   v_coords = a_coords;\n"
													 "   gl_Position = a_position;\n"
													 "}\n";
	const std::string defaultFragSrc = versionDecl + "\n"
													 "in mediump vec4 v_color;\n"
													 "layout(location = 0) out mediump vec4 o_color;\n\n"
													 "void main (void)\n"
													 "{\n"
													 "   o_color = v_color;\n"
													 "}\n";

	// Fill in specialization parameters.
	std::map<std::string, std::string> spParams;
	if (isVertexCase)
	{
		spParams["HEADER"] = versionDecl + "\n"
										   "in highp vec4 a_position;\n"
										   "in highp vec4 a_coords;\n"
										   "out mediump vec4 v_color;";
		spParams["COORDS"]	 = "a_coords";
		spParams["DST"]		   = "v_color";
		spParams["ASSIGN_POS"] = "gl_Position = a_position;";
	}
	else
	{
		spParams["HEADER"] = versionDecl + "\n"
										   "in mediump vec4 v_coords;\n"
										   "layout(location = 0) out mediump vec4 o_color;";
		spParams["COORDS"]	 = "v_coords";
		spParams["DST"]		   = "o_color";
		spParams["ASSIGN_POS"] = "";
	}

	if (isVertexCase)
		return new ShaderStructCase(context, name, description, isVertexCase, usesTextures, evalFunc, setupUniforms,
									StringTemplate(shaderSrc.str()).specialize(spParams).c_str(),
									defaultFragSrc.c_str());
	else
		return new ShaderStructCase(context, name, description, isVertexCase, usesTextures, evalFunc, setupUniforms,
									defaultVertSrc.c_str(),
									StringTemplate(shaderSrc.str()).specialize(spParams).c_str());
}